

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86SHL(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift,int num)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uchar *puVar5;
  
  if (1 < size - sDWORD) {
    __assert_fail("size == sDWORD || size == sQWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x631,"int x86SHL(unsigned char *, x86Size, x86Reg, int, x86Reg, int, int)");
  }
  bVar2 = 8 < (int)base | (8 < (int)index) * '\x02' | (size == sQWORD) << 3;
  if (bVar2 != 0) {
    *stream = bVar2 | 0x40;
  }
  uVar4 = (ulong)(bVar2 != 0);
  stream[uVar4] = (num == 1) << 4 | 0xc1;
  uVar3 = encodeAddress(stream + uVar4 + 1,index,multiplier,base,shift,4);
  lVar1 = uVar3 + uVar4;
  puVar5 = stream + lVar1 + 1;
  if (num != 1) {
    *puVar5 = (uchar)num;
    puVar5 = stream + lVar1 + 2;
  }
  return (int)puVar5 - (int)stream;
}

Assistant:

int x86SHL(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, int num)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);

	stream += encodeRex(stream, size == sQWORD, rNONE, index, base);

	if(num == 1)
		*stream++ = 0xd1;
	else
		*stream++ = 0xc1;

	stream += encodeAddress(stream, index, multiplier, base, shift, 4);

	if(num != 1)
		stream += encodeImmByte(stream, (char)num);

	return int(stream - start);
}